

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev1.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  CascadeStages<4,_Iir::DirectFormI> *this;
  int i;
  int iVar1;
  uint uVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double local_888;
  HighPass<3,_Iir::DirectFormII> f;
  BandStop<4,_Iir::DirectFormI> bs;
  LowPass<8,_Iir::DirectFormII> lp_cheby1;
  
  Iir::PoleFilter<Iir::ChebyshevI::HighPassBase,_Iir::DirectFormII,_3,_3>::PoleFilter
            (&f.super_PoleFilter<Iir::ChebyshevI::HighPassBase,_Iir::DirectFormII,_3,_3>);
  Iir::ChebyshevI::HighPassBase::setup
            (&f.super_PoleFilter<Iir::ChebyshevI::HighPassBase,_Iir::DirectFormII,_3,_3>.
              super_HighPassBase,3,0.005,1.0);
  iVar1 = 100000;
  while (iVar1 != 0) {
    fVar3 = 1.0;
    if (iVar1 != 0x18696) {
      fVar3 = 0.0;
    }
    fVar3 = Iir::CascadeStages<2,_Iir::DirectFormII>::filter<float>
                      (&f.super_PoleFilter<Iir::ChebyshevI::HighPassBase,_Iir::DirectFormII,_3,_3>.
                        super_CascadeStages<2,_Iir::DirectFormII>,fVar3);
    local_888 = (double)fVar3;
    assert_print((uint)!NAN(fVar3),"Highpass output is NAN\n");
    iVar1 = iVar1 + -1;
  }
  assert_print((uint)(ABS(local_888) < 1e-15),"Highpass value for t->inf to high!");
  Iir::PoleFilter<Iir::ChebyshevI::BandStopBase,_Iir::DirectFormI,_4,_8>::PoleFilter
            (&bs.super_PoleFilter<Iir::ChebyshevI::BandStopBase,_Iir::DirectFormI,_4,_8>);
  Iir::ChebyshevI::BandStopBase::setup
            (&bs.super_PoleFilter<Iir::ChebyshevI::BandStopBase,_Iir::DirectFormI,_4,_8>.
              super_BandStopBase,4,0.05,0.005,1.0);
  this = &bs.super_PoleFilter<Iir::ChebyshevI::BandStopBase,_Iir::DirectFormI,_4,_8>.
          super_CascadeStages<4,_Iir::DirectFormI>;
  Iir::CascadeStages<4,_Iir::DirectFormI>::reset(this);
  iVar1 = 100000;
  while (iVar1 != 0) {
    fVar3 = 1.0;
    if (iVar1 != 0x18696) {
      fVar3 = 0.0;
    }
    fVar3 = Iir::CascadeStages<4,_Iir::DirectFormI>::filter<float>(this,fVar3);
    local_888 = (double)fVar3;
    assert_print((uint)!NAN(fVar3),"Bandstop output is NAN\n");
    iVar1 = iVar1 + -1;
  }
  assert_print((uint)(ABS(local_888) < 1e-15),"Bandstop value for t->inf to high!");
  Iir::PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8>::PoleFilter
            (&lp_cheby1.super_PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8>);
  Iir::ChebyshevI::LowPass<8,_Iir::DirectFormII>::setupN
            ((LowPass<8,_Iir::DirectFormII> *)
             &lp_cheby1.super_PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8>,0.01
             ,1.0);
  dVar4 = 0.0;
  for (uVar2 = 0; uVar2 != 10000; uVar2 = uVar2 + 1) {
    dVar5 = sin(dVar4 * 0.6094689747964199);
    dVar5 = Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>
                      (&lp_cheby1.
                        super_PoleFilter<Iir::ChebyshevI::LowPassBase,_Iir::DirectFormII,_8,_8>.
                        super_CascadeStages<4,_Iir::DirectFormII>,dVar5);
    if (5000 < uVar2) {
      assert_print((uint)(ABS(dVar5) < 1e-05),"Lowpass not removing a sine.\n");
    }
    dVar4 = dVar4 + 1.0;
  }
  return 0;
}

Assistant:

int main(int, char**)
{
	const int order = 3;
	Iir::ChebyshevI::HighPass<order> f;
	const float samplingrate = 1000; // Hz
	const float cutoff_frequency = 5; // Hz
	f.setup(samplingrate, cutoff_frequency, 1);
	double b;
	for (int i = 0; i < 100000; i++)
	{
		float a = 0;
		if (i == 10) a = 1;
		b = f.filter(a);
		assert_print(!isnan(b), "Highpass output is NAN\n");
	}
	//fprintf(stderr,"%e\n",b);
	assert_print(fabs(b) < 1E-15, "Highpass value for t->inf to high!");

	Iir::ChebyshevI::BandStop<4, Iir::DirectFormI> bs;
	const float center_frequency = 50;
	const float frequency_width = 5;
	bs.setup(samplingrate, center_frequency, frequency_width, 1);
	bs.reset();
	for (int i = 0; i < 100000; i++)
	{
		float a = 0;
		if (i == 10) a = 1;
		b = bs.filter(a);
		assert_print(!isnan(b), "Bandstop output is NAN\n");
		//fprintf(stderr,"%e\n",b);
	}
	//fprintf(stderr,"%e\n",b);
	assert_print(fabs(b) < 1E-15, "Bandstop value for t->inf to high!");

	Iir::ChebyshevI::LowPass<8> lp_cheby1;
	const float pass_ripple_db2 = 1; // dB
	double norm_cutoff_frequency = 0.01;
	lp_cheby1.setupN(norm_cutoff_frequency,
		pass_ripple_db2);
	double norm_signal_frequency = 0.097;
	for (int i = 0; i < 10000; i++)
	{
		b = fabs(lp_cheby1.filter(sin(2 * M_PI*norm_signal_frequency*i)));
		if (i > 5000) {
			assert_print(b < 1E-5, "Lowpass not removing a sine.\n");
		}
	}

	return 0;


}